

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::SubTestStatus
          (TextureLayerAttachmentTest *this,GLenum attachment,GLenum texture_target,GLuint level,
          GLint layer,GLuint levels,GLint layers)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_220;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0 [2];
  MessageBuilder local_1c0;
  int local_3c;
  long lStack_38;
  GLenum status;
  Functions *gl;
  GLint local_28;
  GLuint levels_local;
  GLint layer_local;
  GLuint level_local;
  GLenum texture_target_local;
  GLenum attachment_local;
  TextureLayerAttachmentTest *this_local;
  
  gl._4_4_ = levels;
  local_28 = layer;
  levels_local = level;
  layer_local = texture_target;
  level_local = attachment;
  _texture_target_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar1);
  local_3c = (**(code **)(lStack_38 + 0x170))(0x8d40);
  bVar4 = local_3c == 0x8cd5;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1c0,
                        (char (*) [79])
                        "Named Framebuffer Texture Layer Attachment test failed because of framebuffer "
                       );
    EVar5 = glu::getFramebufferStatusStr(local_3c);
    local_1f0 = EVar5.m_getName;
    local_1e8 = EVar5.m_value;
    local_1e0[0].m_getName = local_1f0;
    local_1e0[0].m_value = local_1e8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2b2d7b8);
    EVar5 = glu::getTextureTargetStr(layer_local);
    local_210 = EVar5.m_getName;
    local_208 = EVar5.m_value;
    local_200.m_getName = local_210;
    local_200.m_value = local_208;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])0x2a6a75e);
    EVar5 = glu::getFramebufferAttachmentStr(level_local);
    local_220.m_getName = EVar5.m_getName;
    local_220.m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_220);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [31])" attachment and texture level ")
    ;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&levels_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])" and texture layer ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_28);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])" of texture with ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" levels and ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&layers);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])0x2be288e);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  }
  return bVar4;
}

Assistant:

bool TextureLayerAttachmentTest::SubTestStatus(glw::GLenum attachment, glw::GLenum texture_target, glw::GLuint level,
											   glw::GLint layer, glw::GLuint levels, glw::GLint layers)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check framebuffer status. */
	glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (GL_FRAMEBUFFER_COMPLETE != status)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed because of framebuffer "
			<< glu::getFramebufferStatusStr(status) << " with " << glu::getTextureTargetStr(texture_target)
			<< " texture set up as " << glu::getFramebufferAttachmentStr(attachment) << " attachment and texture level "
			<< level << " and texture layer " << layer << " of texture with " << levels << " levels and " << layers
			<< " layers." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}